

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_sendf(curl_socket_t sockfd,connectdata *conn,char *fmt,...)

{
  char in_AL;
  CURLcode CVar1;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [24];
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined1 local_68 [8];
  va_list ap;
  char *sptr;
  char *s;
  size_t sStack_38;
  CURLcode result;
  size_t write_len;
  ssize_t bytes_written;
  Curl_easy *data;
  char *fmt_local;
  connectdata *conn_local;
  curl_socket_t sockfd_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  bytes_written = (ssize_t)conn->data;
  ap[0].overflow_arg_area = local_118;
  ap[0]._0_8_ = &stack0x00000008;
  local_68._4_4_ = 0x30;
  local_68._0_4_ = 0x18;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  data = (Curl_easy *)fmt;
  fmt_local = (char *)conn;
  conn_local._0_4_ = sockfd;
  __s = curl_mvaprintf(fmt,(__va_list_tag *)local_68);
  if (__s == (char *)0x0) {
    conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    write_len = 0;
    sStack_38 = strlen(__s);
    ap[0].reg_save_area = __s;
    while (CVar1 = Curl_write((connectdata *)fmt_local,(curl_socket_t)conn_local,ap[0].reg_save_area
                              ,sStack_38,(ssize_t *)&write_len), CVar1 == CURLE_OK) {
      if ((*(ulong *)(bytes_written + 0xef0) >> 0x1e & 1) != 0) {
        Curl_debug((Curl_easy *)bytes_written,CURLINFO_DATA_OUT,(char *)ap[0].reg_save_area,
                   write_len);
      }
      if (write_len == sStack_38) break;
      sStack_38 = sStack_38 - write_len;
      ap[0].reg_save_area = (void *)(write_len + (long)ap[0].reg_save_area);
    }
    (*Curl_cfree)(__s);
    conn_local._4_4_ = CVar1;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_sendf(curl_socket_t sockfd, struct connectdata *conn,
                    const char *fmt, ...)
{
  struct Curl_easy *data = conn->data;
  ssize_t bytes_written;
  size_t write_len;
  CURLcode result = CURLE_OK;
  char *s;
  char *sptr;
  va_list ap;
  va_start(ap, fmt);
  s = vaprintf(fmt, ap); /* returns an allocated string */
  va_end(ap);
  if(!s)
    return CURLE_OUT_OF_MEMORY; /* failure */

  bytes_written = 0;
  write_len = strlen(s);
  sptr = s;

  for(;;) {
    /* Write the buffer to the socket */
    result = Curl_write(conn, sockfd, sptr, write_len, &bytes_written);

    if(result)
      break;

    if(data->set.verbose)
      Curl_debug(data, CURLINFO_DATA_OUT, sptr, (size_t)bytes_written);

    if((size_t)bytes_written != write_len) {
      /* if not all was written at once, we must advance the pointer, decrease
         the size left and try again! */
      write_len -= bytes_written;
      sptr += bytes_written;
    }
    else
      break;
  }

  free(s); /* free the output string */

  return result;
}